

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

bool isAudioStreamType(StreamType stream_coding_type)

{
  if (((0x22 < stream_coding_type - AUDIO_LPCM) ||
      ((0x6000000ffU >> ((ulong)(stream_coding_type - AUDIO_LPCM) & 0x3f) & 1) == 0)) &&
     ((AUDIO_AAC_RAW < stream_coding_type ||
      ((0x28018U >> (stream_coding_type & (VIDEO_MPEG4|AUDIO_AAC)) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool isAudioStreamType(const StreamType stream_coding_type)
{
    switch (stream_coding_type)
    {
    case StreamType::AUDIO_LPCM:
    case StreamType::AUDIO_AC3:
    case StreamType::AUDIO_DTS:
    case StreamType::AUDIO_TRUE_HD:
    case StreamType::AUDIO_EAC3:
    case StreamType::AUDIO_EAC3_ATSC:
    case StreamType::AUDIO_DTS_HD:
    case StreamType::AUDIO_DTS_HD_MA:
    case StreamType::AUDIO_EAC3_SECONDARY:
    case StreamType::AUDIO_DTS_HD_SECONDARY:
    case StreamType::AUDIO_AAC:
    case StreamType::AUDIO_AAC_RAW:
    case StreamType::AUDIO_MPEG1:
    case StreamType::AUDIO_MPEG2:
        return true;
    default:
        return false;
    }
}